

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:946:7),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:946:7),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> depResult;
  ExceptionOr<kj::_::Void> local_5d8;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_470;
  Exception local_2c8;
  Exception local_170;
  
  local_470.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_470.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_470.super_ExceptionOrValue);
  if (local_470.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception(&local_2c8,&local_470.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_170.ownFile.content.ptr = local_2c8.ownFile.content.ptr;
    local_170.ownFile.content.size_ = local_2c8.ownFile.content.size_;
    local_170.ownFile.content.disposer = local_2c8.ownFile.content.disposer;
    local_2c8.ownFile.content.ptr = (char *)0x0;
    local_2c8.ownFile.content.size_ = 0;
    local_170.file = local_2c8.file;
    local_170.line = local_2c8.line;
    local_170.type = local_2c8.type;
    local_170.description.content.ptr = local_2c8.description.content.ptr;
    local_170.description.content.size_ = local_2c8.description.content.size_;
    local_2c8.description.content.ptr = (char *)0x0;
    local_2c8.description.content.size_ = 0;
    local_170.description.content.disposer = local_2c8.description.content.disposer;
    local_170.context.ptr.disposer = local_2c8.context.ptr.disposer;
    local_170.context.ptr.ptr = local_2c8.context.ptr.ptr;
    local_2c8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_170.trace,local_2c8.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_5d8,&local_170);
    local_5d8.value.ptr.isSet = false;
    Exception::~Exception(&local_170);
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_5d8);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_5d8);
    Exception::~Exception(&local_2c8);
  }
  else if (local_470.value.ptr.isSet == true) {
    anon_class_16_2_06e2585c_for_func::operator()(&this->func,&local_470.value.ptr.field_1.value);
    local_5d8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5d8.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_5d8);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_5d8);
  }
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::
  ~ExceptionOr(&local_470);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }